

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall
Assimp::SMDImporter::ParseSkeletonSection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  bool bVar1;
  int iVar2;
  int iTime_00;
  SMDImporter *this_00;
  int iTime;
  char *szCurrent_local;
  char **local_38;
  
  iTime = 0;
  iTime_00 = 0;
  szCurrent_local = szCurrent;
  local_38 = szCurrentOut;
  while( true ) {
    while( true ) {
      bVar1 = SkipSpacesAndLineEnd(this,szCurrent_local,&szCurrent_local);
      if ((!bVar1) || (bVar1 = TokenMatch<char_const>(&szCurrent_local,"end",3), bVar1))
      goto LAB_00540fb2;
      this_00 = (SMDImporter *)&szCurrent_local;
      bVar1 = TokenMatch<char_const>(&szCurrent_local,"time",4);
      if (bVar1) break;
      ParseSkeletonElement(this,szCurrent_local,&szCurrent_local,iTime_00);
    }
    bVar1 = ParseSignedInt(this_00,szCurrent_local,&szCurrent_local,&iTime);
    iTime_00 = iTime;
    if (!bVar1) break;
    iVar2 = this->iSmallestFrame;
    if (iTime < this->iSmallestFrame) {
      iVar2 = iTime;
    }
    this->iSmallestFrame = iVar2;
    SkipLine(this,szCurrent_local,&szCurrent_local);
  }
LAB_00540fb2:
  *local_38 = szCurrent_local;
  return;
}

Assistant:

void SMDImporter::ParseSkeletonSection(const char* szCurrent, const char** szCurrentOut) {
    int iTime = 0;
    for ( ;; ) {
        if (!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the skeleton section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        } else if (TokenMatch(szCurrent,"time",4)) {
        // "time <n>\n" - Specifies the current animation frame
            if(!ParseSignedInt(szCurrent,&szCurrent,iTime)) {
                break;
            }

            iSmallestFrame = std::min(iSmallestFrame,iTime);
            SkipLine(szCurrent,&szCurrent);
        } else {
            ParseSkeletonElement(szCurrent,&szCurrent,iTime);
        }
    }
    *szCurrentOut = szCurrent;
}